

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O0

void __thiscall n_pca::NPca::saveData(NPca *this)

{
  byte bVar1;
  long lVar2;
  undefined8 uVar3;
  ostream *poVar4;
  void *pvVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  Index IVar9;
  RowXpr local_2a0;
  int local_264;
  undefined1 local_260 [4];
  int i_2;
  int local_228;
  int local_224;
  int i_1;
  int i;
  long local_210;
  ofstream file;
  NPca *this_local;
  
  printf("start save...\n");
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    printf("couldn\'t find save path!\n");
  }
  else {
    uVar3 = std::__cxx11::string::c_str();
    std::ofstream::ofstream(&local_210,uVar3,0x10);
    bVar1 = std::ofstream::is_open();
    if ((bVar1 & 1) == 0) {
      printf("open file failed!\n");
      i_1 = 1;
    }
    else {
      std::ios::clear((long)&local_210 + *(long *)(local_210 + -0x18),0);
      poVar4 = std::operator<<((ostream *)&local_210,"dimension: ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,this->n_config_->dimension_);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&local_210,"image_width: ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,this->n_config_->image_width_);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&local_210,"image_height: ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,this->n_config_->image_height_);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&local_210,"train_mean: ");
      poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                        &this->train_mean_);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&local_210,"train_label: ");
      local_224 = 0;
      while( true ) {
        uVar6 = (ulong)local_224;
        sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->train_label_);
        if (sVar7 <= uVar6) break;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->train_label_,(long)local_224);
        poVar4 = (ostream *)std::ostream::operator<<(&local_210,*pvVar8);
        std::operator<<(poVar4," ");
        local_224 = local_224 + 1;
      }
      std::ostream::operator<<(&local_210,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&local_210,"train_data_matrix: ");
      local_228 = 0;
      while( true ) {
        lVar2 = (long)local_228;
        IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                          (&(this->train_data_matrix_).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
        if (IVar9 <= lVar2) break;
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                  ((RowXpr *)local_260,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->train_data_matrix_
                   ,(long)local_228);
        poVar4 = Eigen::operator<<((ostream *)&local_210,
                                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                                    *)local_260);
        std::operator<<(poVar4,",");
        local_228 = local_228 + 1;
      }
      std::ostream::operator<<(&local_210,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&local_210,"basic_matrix:");
      local_264 = 0;
      while( true ) {
        lVar2 = (long)local_264;
        IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                          (&(this->basic_matrix_).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
        if (IVar9 <= lVar2) break;
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                  (&local_2a0,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->basic_matrix_,
                   (long)local_264);
        poVar4 = Eigen::operator<<((ostream *)&local_210,
                                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                                    *)&local_2a0);
        std::operator<<(poVar4,",");
        local_264 = local_264 + 1;
      }
      std::ostream::operator<<(&local_210,std::endl<char,std::char_traits<char>>);
      std::ofstream::close();
      uVar3 = std::__cxx11::string::c_str();
      printf("save data to %s\n",uVar3);
      i_1 = 0;
    }
    std::ofstream::~ofstream(&local_210);
  }
  return;
}

Assistant:

void NPca::saveData()
{
    printf("start save...\n");
    if (n_config_->save_data_path_.size() < 1)
    {
        printf("couldn't find save path!\n");
        return;
    }

    ofstream file(n_config_->save_data_path_.c_str());
    
    if (!file.is_open())
    {
        printf("open file failed!\n");
        return;
    }

    file.clear();
    file<<"dimension: "<<n_config_->dimension_<<endl;
    file<<"image_width: "<<n_config_->image_width_<<endl;
    file<<"image_height: "<<n_config_->image_height_<<endl;
    file<<"train_mean: "<<train_mean_<<endl;

    file<<"train_label: ";
    for (int i = 0; i < train_label_.size(); i++)
        file<<train_label_[i]<<" ";
    file<<endl;
    
    file<<"train_data_matrix: ";
    for (int i = 0; i < train_data_matrix_.rows(); i++)
        file<<train_data_matrix_.row(i)<<",";
    file<<endl;

    file<<"basic_matrix:";
    for (int i = 0; i < basic_matrix_.rows(); i++)
        file<<basic_matrix_.row(i)<<",";
    file<<endl;

    file.close();

    printf("save data to %s\n", n_config_->save_data_path_.c_str());
}